

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

ostream * __thiscall nivalis::Function::to_bin(Function *this,ostream *os)

{
  pointer pEVar1;
  int i;
  long lVar2;
  ulong uVar3;
  size_type local_30;
  
  local_30 = (this->name)._M_string_length;
  std::ostream::write((char *)os,(long)&local_30);
  std::ostream::write((char *)os,(long)(this->name)._M_dataplus._M_p);
  local_30 = CONCAT44(local_30._4_4_,this->type);
  std::ostream::write((char *)os,(long)&local_30);
  local_30 = (this->expr_str)._M_string_length;
  std::ostream::write((char *)os,(long)&local_30);
  std::ostream::write((char *)os,(long)(this->expr_str)._M_dataplus._M_p);
  Expr::to_bin(&this->expr,os);
  Expr::to_bin(&this->diff,os);
  Expr::to_bin(&this->ddiff,os);
  Expr::to_bin(&this->recip,os);
  Expr::to_bin(&this->drecip,os);
  lVar2 = 0;
  do {
    local_30 = CONCAT44(local_30._4_4_,(this->line_color).data[lVar2]);
    std::ostream::write((char *)os,(long)&local_30);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_30._0_4_ = this->tmin;
  std::ostream::write((char *)os,(long)&local_30);
  local_30 = CONCAT44(local_30._4_4_,this->tmax);
  std::ostream::write((char *)os,(long)&local_30);
  local_30 = ((long)(this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  std::ostream::write((char *)os,(long)&local_30);
  pEVar1 = (this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      Expr::to_bin((Expr *)((long)&(pEVar1->ast).
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar2),os);
      uVar3 = uVar3 + 1;
      pEVar1 = (this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < (ulong)(((long)(this->exprs).
                                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3)
                            * -0x5555555555555555));
  }
  local_30 = (this->str)._M_string_length;
  std::ostream::write((char *)os,(long)&local_30);
  std::ostream::write((char *)os,(long)(this->str)._M_dataplus._M_p);
  return os;
}

Assistant:

std::ostream& Function::to_bin(std::ostream& os) const {
    util::write_bin(os, name.size());
    os.write(name.c_str(), name.size());
    util::write_bin(os, type);
    util::write_bin(os, expr_str.size());
    os.write(expr_str.c_str(), expr_str.size());

    expr.to_bin(os); diff.to_bin(os);
    ddiff.to_bin(os); recip.to_bin(os);
    drecip.to_bin(os);
    for (int i = 0; i < 4; ++i) util::write_bin(os, line_color.data[i]);
    util::write_bin(os, tmin);
    util::write_bin(os, tmax);

    util::write_bin(os, exprs.size());
    for (size_t i = 0; i < exprs.size(); ++i) {
        exprs[i].to_bin(os);
    }

    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}